

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.cpp
# Opt level: O0

void anon_unknown.dwarf_113fb::_create_window_with_message_loop
               (WindowHandle user_data,string *title,int x,int y,int w,int h)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  Display *pDVar4;
  Window WVar5;
  GC p_Var6;
  undefined8 uVar7;
  Pixmap PVar8;
  char *pcVar9;
  XImage *pXVar10;
  undefined4 uVar12;
  ulong uVar11;
  undefined8 uVar13;
  undefined4 uVar15;
  ulong uVar14;
  int local_25c;
  duration<double,_std::ratio<1L,_1000000L>_> local_258;
  duration<double,_std::ratio<1L,_1000000L>_> local_250;
  int local_244;
  duration<double,_std::ratio<1L,_1000000L>_> local_240;
  duration<long,_std::ratio<1L,_1000000000L>_> local_238;
  duration<double,_std::ratio<1L,_1000000L>_> local_230;
  duration<double,_std::ratio<1L,_1000000L>_> time_elapsed;
  time_point toc;
  XConfigureEvent xce;
  XEvent nev;
  int local_100;
  unsigned_short is_retriggered;
  XEvent ev;
  time_point tic;
  Atom wmDeleteMessage;
  int screen_num;
  int h_local;
  int w_local;
  int y_local;
  int x_local;
  string *title_local;
  WindowHandle user_data_local;
  
  std::mutex::lock(&user_data->mt);
  pDVar4 = (Display *)XOpenDisplay(0);
  user_data->display = pDVar4;
  iVar1 = *(int *)(user_data->display + 0xe0);
  uVar7 = *(undefined8 *)(*(long *)(user_data->display + 0xe8) + (long)iVar1 * 0x80 + 0x60);
  uVar13 = *(undefined8 *)(*(long *)(user_data->display + 0xe8) + (long)iVar1 * 0x80 + 0x58);
  WVar5 = XCreateSimpleWindow(user_data->display,
                              *(undefined8 *)
                               (*(long *)(user_data->display + 0xe8) + (long)iVar1 * 0x80 + 0x10),x,
                              y,w,h,2,uVar7,uVar13);
  uVar15 = (undefined4)((ulong)uVar13 >> 0x20);
  uVar12 = (undefined4)((ulong)uVar7 >> 0x20);
  user_data->win = WVar5;
  user_data->visual = *(Visual **)(*(long *)(user_data->display + 0xe8) + (long)iVar1 * 0x80 + 0x40)
  ;
  p_Var6 = create_gc(user_data->display,user_data->win,0);
  user_data->gc = p_Var6;
  pDVar4 = user_data->display;
  WVar5 = user_data->win;
  uVar7 = std::__cxx11::string::c_str();
  XStoreName(pDVar4,WVar5,uVar7);
  XMapWindow(user_data->display,user_data->win);
  XSync(user_data->display,0);
  XSelectInput(user_data->display,user_data->win,0x28003);
  PVar8 = XCreatePixmap(user_data->display,
                        *(undefined8 *)
                         (*(long *)(user_data->display + 0xe8) +
                          (long)*(int *)(user_data->display + 0xe0) * 0x80 + 0x10),w,h);
  user_data->pix = PVar8;
  user_data->pix_w = w;
  user_data->pix_h = h;
  pcVar9 = (char *)malloc((long)w * (long)h * 4);
  user_data->data = pcVar9;
  memset(user_data->data,0,(long)w * (long)h * 4);
  uVar11 = CONCAT44(uVar12,h);
  uVar7 = CONCAT44(uVar15,0x20);
  pXVar10 = (XImage *)
            XCreateImage(user_data->display,user_data->visual,
                         *(undefined4 *)
                          (*(long *)(user_data->display + 0xe8) + (long)iVar1 * 0x80 + 0x38),2,0,
                         user_data->data,w,uVar11,uVar7,0);
  user_data->im = pXVar10;
  uVar11 = uVar11 & 0xffffffff00000000;
  uVar14 = CONCAT44((int)((ulong)uVar7 >> 0x20),user_data->pix_w);
  XPutImage(user_data->display,user_data->pix,user_data->gc,user_data->im,0,0,0,uVar11,uVar14,
            user_data->pix_h);
  tic.__d.__r = (duration)XInternAtom(user_data->display,"WM_DELETE_WINDOW",0);
  XSetWMProtocols(user_data->display,user_data->win,&tic,1);
  std::atomic<bool>::operator=(&user_data->quit,false);
  user_data->initialised = true;
  std::condition_variable::notify_all();
  std::mutex::unlock(&user_data->mt);
  do {
    bVar2 = std::atomic::operator_cast_to_bool((atomic *)&user_data->quit);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      return;
    }
    ev.pad[0x17] = std::chrono::_V2::system_clock::now();
    while( true ) {
      bVar2 = false;
      if (user_data->display != (Display *)0x0) {
        iVar3 = XPending(user_data->display);
        bVar2 = iVar3 != 0;
      }
      if (!bVar2) break;
      XNextEvent(user_data->display,&local_100);
      uVar12 = (undefined4)(uVar11 >> 0x20);
      if (local_100 - 2U < 0x1f || local_100 == 0x21) {
        switch((long)&switchD_0010b6dc::switchdataD_0010e414 +
               (long)(int)(&switchD_0010b6dc::switchdataD_0010e414)[local_100 - 2U]) {
        case 0x10b6de:
          std::mutex::lock(&user_data->mt);
          uVar11 = CONCAT44(uVar12,user_data->pix_h);
          uVar14 = uVar14 & 0xffffffff00000000;
          XCopyArea(user_data->display,user_data->pix,user_data->win,user_data->gc,0,0,
                    user_data->pix_w,uVar11,uVar14,0);
          std::mutex::unlock(&user_data->mt);
          break;
        case 0x10b74e:
          if (user_data->listener != (IWindowListener *)0x0) {
            (**(code **)(*(long *)user_data->listener + 8))(user_data->listener,ev.xkey.y_root);
          }
          break;
        case 0x10b778:
          bVar2 = false;
          iVar3 = XEventsQueued(user_data->display,1);
          if ((((iVar3 != 0) &&
               (XPeekEvent(user_data->display,&xce.override_redirect), xce.override_redirect == 2))
              && (nev.xkey.subwindow == ev.xkey.subwindow)) && (nev.xkey.y_root == ev.xkey.y_root))
          {
            XNextEvent(user_data->display,&local_100);
            bVar2 = true;
          }
          if ((!bVar2) && (user_data->listener != (IWindowListener *)0x0)) {
            (**(code **)(*(long *)user_data->listener + 0x10))(user_data->listener,ev.xkey.y_root);
          }
          break;
        case 0x10b823:
          std::mutex::lock(&user_data->mt);
          std::atomic<bool>::operator=(&user_data->quit,true);
          if (user_data->listener != (IWindowListener *)0x0) {
            (*(code *)**(undefined8 **)user_data->listener)();
          }
          (*(user_data->im->f).destroy_image)(user_data->im);
          XFreePixmap(user_data->display,user_data->pix);
          XCloseDisplay(user_data->display);
          user_data->display = (Display *)0x0;
          user_data->listener = (IWindowListener *)0x0;
          std::mutex::unlock(&user_data->mt);
          break;
        case 0x10b8c2:
          memcpy(&toc,&local_100,0x58);
          uVar15 = (undefined4)(uVar14 >> 0x20);
          uVar12 = (undefined4)(uVar11 >> 0x20);
          if ((xce.x != user_data->pix_w) || (xce.y != user_data->pix_h)) {
            std::mutex::lock(&user_data->mt);
            XFreePixmap(user_data->display,user_data->pix);
            (*(user_data->im->f).destroy_image)(user_data->im);
            pcVar9 = (char *)malloc((long)xce.x * (long)xce.y * 4);
            user_data->data = pcVar9;
            uVar11 = CONCAT44(uVar12,xce.y);
            uVar7 = CONCAT44(uVar15,0x20);
            pXVar10 = (XImage *)
                      XCreateImage(user_data->display,user_data->visual,
                                   *(undefined4 *)
                                    (*(long *)(user_data->display + 0xe8) + (long)iVar1 * 0x80 +
                                    0x38),2,0,user_data->data,xce.x,uVar11,uVar7,0);
            uVar12 = (undefined4)((ulong)uVar7 >> 0x20);
            user_data->im = pXVar10;
            PVar8 = XCreatePixmap(user_data->display,
                                  *(undefined8 *)
                                   (*(long *)(user_data->display + 0xe8) +
                                    (long)*(int *)(user_data->display + 0xe0) * 0x80 + 0x10),xce.x,
                                  xce.y,*(undefined4 *)
                                         (*(long *)(user_data->display + 0xe8) + (long)iVar1 * 0x80
                                         + 0x38));
            user_data->pix = PVar8;
            user_data->pix_w = xce.x;
            user_data->pix_h = xce.y;
            if ((user_data->w == 0) || (user_data->h == 0)) {
              memset(user_data->data,0,(long)xce.x * (long)xce.y * 4);
            }
            else {
              _scale((uint32_t *)user_data->data,user_data->pix_w,user_data->pix_h,user_data->bytes,
                     user_data->w,user_data->h);
            }
            uVar11 = uVar11 & 0xffffffff00000000;
            uVar14 = CONCAT44(uVar12,user_data->pix_w);
            XPutImage(user_data->display,user_data->pix,user_data->gc,user_data->im,0,0,0,uVar11,
                      uVar14,user_data->pix_h);
            XFlush(user_data->display);
            std::mutex::unlock(&user_data->mt);
          }
          break;
        case 0x10bb2c:
          goto switchD_0010b6dc_caseD_10bb2c;
        }
      }
      else {
switchD_0010b6dc_caseD_10bb2c:
      }
    }
    time_elapsed.__r = (rep)std::chrono::_V2::system_clock::now();
    local_238.__r =
         (rep_conflict)
         std::chrono::operator-
                   ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                     *)&time_elapsed,
                    (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                     *)(ev.pad + 0x17));
    std::chrono::duration<double,std::ratio<1l,1000000l>>::
    duration<long,std::ratio<1l,1000000000l>,void>
              ((duration<double,std::ratio<1l,1000000l>> *)&local_230,&local_238);
    local_244 = 1000;
    std::chrono::duration<double,std::ratio<1l,1000000l>>::duration<int,void>
              ((duration<double,std::ratio<1l,1000000l>> *)&local_240,&local_244);
    bVar2 = std::chrono::operator<(&local_230,&local_240);
    if (bVar2) {
      local_25c = 1000;
      std::chrono::duration<double,std::ratio<1l,1000000l>>::duration<int,void>
                ((duration<double,std::ratio<1l,1000000l>> *)&local_258,&local_25c);
      local_250.__r = (rep)std::chrono::operator-(&local_258,&local_230);
      std::this_thread::sleep_for<double,std::ratio<1l,1000000l>>(&local_250);
    }
  } while( true );
}

Assistant:

void _create_window_with_message_loop(WindowHandle user_data, const std::string& title, int x, int y, int w, int h)
    {
    user_data->mt.lock();
    user_data->display = XOpenDisplay(0);
    int screen_num = DefaultScreen(user_data->display);

    user_data->win = XCreateSimpleWindow(user_data->display, RootWindow(user_data->display, screen_num),
      x, y, w, h, 2, BlackPixel(user_data->display, screen_num),
      WhitePixel(user_data->display, screen_num));

    user_data->visual = DefaultVisual(user_data->display, screen_num);
    user_data->gc = create_gc(user_data->display, user_data->win, 0);

    XStoreName(user_data->display, user_data->win, title.c_str());
    XMapWindow(user_data->display, user_data->win);
    XSync(user_data->display, False);
    XSelectInput(user_data->display, user_data->win, ExposureMask | StructureNotifyMask | KeyPressMask | KeyReleaseMask); // Set the events we want to receive
    
    user_data->pix = XCreatePixmap(user_data->display, DefaultRootWindow(user_data->display), w, h, DefaultDepth(user_data->display, screen_num)); // Pixmap for off-screen rendering
    user_data->pix_w = w;
    user_data->pix_h = h;
    
    user_data->data = (char*)malloc(sizeof(uint8_t)*w*h * 4); // Pointer to memory for off-screen rendering
    memset(user_data->data, 0, sizeof(uint8_t)*w*h * 4); // Initialize to black
    user_data->im = XCreateImage(user_data->display, user_data->visual, DefaultDepth(user_data->display, screen_num), ZPixmap, 0, user_data->data, w, h, 32, 0); // Container for user_data->data
    XPutImage(user_data->display, user_data->pix, user_data->gc, user_data->im, 0, 0, 0, 0, user_data->pix_w, user_data->pix_h); // Draw the XImage on the Pixmap
    
    Atom wmDeleteMessage = XInternAtom(user_data->display, "WM_DELETE_WINDOW", False); // When the close button is pressed, the window manager should send this to us as a event (ClientMessage).
    XSetWMProtocols(user_data->display, user_data->win, &wmDeleteMessage, 1);   
    
    user_data->quit = false;
    user_data->initialised = true;
    user_data->cv.notify_all();
    user_data->mt.unlock();

    while (!user_data->quit)
      {
      auto tic = std::chrono::high_resolution_clock::now();
      while (user_data->display && XPending(user_data->display))
        {
        XEvent ev;
        XNextEvent(user_data->display, &ev);
        //printf("event type: %d\n", ev.type); 
        switch (ev.type)
          {
          case Expose:
          {
          user_data->mt.lock();
          XCopyArea(user_data->display, user_data->pix, user_data->win, user_data->gc, 0, 0, user_data->pix_w, user_data->pix_h, 0, 0); // Copy the pixmap to the window for on-screen rendering.
          user_data->mt.unlock();
          break;
          }
          case KeyPress:
          {
          if (user_data->listener)
            user_data->listener->OnKeyDown(ev.xkey.keycode);
          break;
          }
          case KeyRelease:
          {
          unsigned short is_retriggered = 0;
          
          if (XEventsQueued(user_data->display, QueuedAfterReading))
            {
            XEvent nev;
            XPeekEvent(user_data->display, &nev);
            
            if (nev.type == KeyPress && nev.xkey.time == ev.xkey.time && nev.xkey.keycode == ev.xkey.keycode)
              {
              XNextEvent(user_data->display, &ev);
              is_retriggered = 1;
              }
            }
          
          
          if (!is_retriggered && user_data->listener)
            user_data->listener->OnKeyUp(ev.xkey.keycode);
          break;
          }
          case ClientMessage:
          {
          user_data->mt.lock();
          user_data->quit = true;
          if (user_data->listener)
            user_data->listener->OnClose();
          XDestroyImage(user_data->im);
          XFreePixmap(user_data->display, user_data->pix);
          XCloseDisplay(user_data->display);
          user_data->display = nullptr;
          user_data->listener = nullptr;
          user_data->mt.unlock();
          break;
          }
          case ConfigureNotify:
          {
          XConfigureEvent xce = ev.xconfigure;
          if (xce.width != user_data->pix_w || xce.height != user_data->pix_h)
            {
            user_data->mt.lock();
            XFreePixmap(user_data->display, user_data->pix); // Free pixmap  
            XDestroyImage(user_data->im); // Free XImage (and user_data->data)
            user_data->data = (char*)malloc(sizeof(uint8_t)*xce.width*xce.height * 4); // Allocate new memory
            user_data->im = XCreateImage(user_data->display, user_data->visual, DefaultDepth(user_data->display, screen_num), ZPixmap, 0, user_data->data, xce.width, xce.height, 32, 0);   // Create container for user_data->data as XImage.
            user_data->pix = XCreatePixmap(user_data->display, DefaultRootWindow(user_data->display), xce.width, xce.height, DefaultDepth(user_data->display, screen_num)); // Create Pixmap
            user_data->pix_w = xce.width;
            user_data->pix_h = xce.height;
            if (user_data->w && user_data->h)
              _scale((uint32_t*)user_data->data, user_data->pix_w, user_data->pix_h, (uint32_t*)user_data->bytes, user_data->w, user_data->h); // Mipmap user bitmap (user_data->bytes) to screen bitmap
            else
              memset(user_data->data, 0, sizeof(uint8_t)*xce.width*xce.height * 4);
            XPutImage(user_data->display, user_data->pix, user_data->gc, user_data->im, 0, 0, 0, 0, user_data->pix_w, user_data->pix_h); // Copy XImage to Pixmap
            XFlush(user_data->display);
            user_data->mt.unlock();            
            }
          break;
          }
          default: break;
          }
        }
      auto toc = std::chrono::high_resolution_clock::now();
      const std::chrono::duration<double, std::micro> time_elapsed = (toc-tic);
      if (time_elapsed < std::chrono::duration<double, std::micro>(1000))
        std::this_thread::sleep_for(std::chrono::duration<double, std::micro>(1000)-time_elapsed);
      }
    }